

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.h
# Opt level: O0

void __thiscall snmalloc::LocalEntropy::make_free_list_key(LocalEntropy *this,FreeListKey *key)

{
  uint64_t uVar1;
  uint64_t *in_RSI;
  LocalEntropy *in_RDI;
  
  uVar1 = get_next(in_RDI);
  *in_RSI = uVar1;
  uVar1 = get_next(in_RDI);
  in_RSI[1] = uVar1;
  uVar1 = get_next(in_RDI);
  in_RSI[2] = uVar1;
  return;
}

Assistant:

void make_free_list_key(FreeListKey& key)
    {
      if constexpr (bits::BITS == 64)
      {
        key.key1 = static_cast<address_t>(get_next());
        key.key2 = static_cast<address_t>(get_next());
        key.key_next = static_cast<address_t>(get_next());
      }
      else
      {
        key.key1 = static_cast<address_t>(get_next() & 0xffff'ffff);
        key.key2 = static_cast<address_t>(get_next() & 0xffff'ffff);
        key.key_next = static_cast<address_t>(get_next() & 0xffff'ffff);
      }
    }